

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O1

Bal_Man_t * Bal_ManAlloc(Gia_Man_t *pGia,Gia_Man_t *pNew,int nLutSize,int nCutNum,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Bal_Man_t *pBVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  ulong uVar8;
  abctime aVar9;
  int iVar10;
  timespec ts;
  timespec local_40;
  
  pBVar3 = (Bal_Man_t *)calloc(1,0x38);
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    aVar9 = -1;
  }
  else {
    aVar9 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  pBVar3->clkStart = aVar9;
  pBVar3->pGia = pGia;
  pBVar3->pNew = pNew;
  pBVar3->nLutSize = nLutSize;
  pBVar3->nCutNum = nCutNum;
  pBVar3->fVerbose = fVerbose;
  iVar2 = (pGia->nObjs * 3) / 2;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar10 = iVar2;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar10;
  if (iVar10 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar10 << 2);
  }
  pVVar4->pArray = piVar5;
  pBVar3->vCosts = pVVar4;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  if (iVar2 - 1U < 7) {
    iVar2 = 8;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar2;
  if (iVar2 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)iVar2 << 3);
  }
  pVVar6->pArray = ppvVar7;
  pBVar3->vCutSets = pVVar6;
  uVar1 = pNew->nObjs;
  if (iVar10 < (int)uVar1) {
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar1 << 2);
    }
    pVVar4->pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar4->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset(pVVar4->pArray,0,(ulong)uVar1 * 4);
  }
  pVVar4->nSize = uVar1;
  uVar1 = pNew->nObjs;
  if (pVVar6->nCap < (int)uVar1) {
    if (ppvVar7 == (void **)0x0) {
      ppvVar7 = (void **)malloc((long)(int)uVar1 << 3);
    }
    else {
      ppvVar7 = (void **)realloc(ppvVar7,(long)(int)uVar1 << 3);
    }
    pVVar6->pArray = ppvVar7;
    pVVar6->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    uVar8 = 0;
    do {
      pVVar6->pArray[uVar8] = (void *)0x0;
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
  }
  pVVar6->nSize = uVar1;
  pNew->pData = pBVar3;
  return pBVar3;
}

Assistant:

Bal_Man_t * Bal_ManAlloc( Gia_Man_t * pGia, Gia_Man_t * pNew, int nLutSize, int nCutNum, int fVerbose )
{
    Bal_Man_t * p;
    p = ABC_CALLOC( Bal_Man_t, 1 );
    p->clkStart = Abc_Clock();
    p->pGia     = pGia;
    p->pNew     = pNew;
    p->nLutSize = nLutSize;
    p->nCutNum  = nCutNum;
    p->fVerbose = fVerbose;
    p->vCosts   = Vec_IntAlloc( 3 * Gia_ManObjNum(pGia) / 2 );
    p->vCutSets = Vec_PtrAlloc( 3 * Gia_ManObjNum(pGia) / 2 );
    Vec_IntFill( p->vCosts, Gia_ManObjNum(pNew), 0 );
    Vec_PtrFill( p->vCutSets, Gia_ManObjNum(pNew), NULL );
    pNew->pData = p;
    return p;
}